

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassBuilder.cpp
# Opt level: O3

ClassBuilder * __thiscall
Lodtalk::ClassBuilder::setSuperclass(ClassBuilder *this,Class *superClass,Metaclass *metaSuper)

{
  undefined8 *puVar1;
  char *__function;
  
  puVar1 = (undefined8 *)(this->clazz).reference.oop.field_0.uintValue;
  if (puVar1 != &NilObject) {
    puVar1[1] = superClass;
    puVar1 = (undefined8 *)(this->clazz).reference.oop.field_0.uintValue;
    if (superClass == (Class *)&NilObject) {
      if (puVar1 != &NilObject) {
        puVar1[3] = 1;
        puVar1 = (undefined8 *)(this->clazz).reference.oop.field_0.uintValue;
        if (puVar1 != &NilObject) {
          puVar1[4] = 1;
          goto LAB_00133545;
        }
      }
    }
    else if (puVar1 != &NilObject) {
      *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar1 + 3) =
           (superClass->super_ClassDescription).super_Behavior.format.field_0;
      puVar1 = (undefined8 *)(this->clazz).reference.oop.field_0.uintValue;
      if (puVar1 != &NilObject) {
        *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar1 + 4) =
             (superClass->super_ClassDescription).super_Behavior.fixedVariableCount.field_0;
LAB_00133545:
        puVar1 = (undefined8 *)(this->metaclass).reference.oop.field_0.uintValue;
        if (puVar1 != &NilObject) {
          puVar1[1] = metaSuper;
          puVar1 = (undefined8 *)(this->metaclass).reference.oop.field_0.uintValue;
          if (puVar1 != &NilObject) {
            *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar1 + 3) =
                 (metaSuper->super_ClassDescription).super_Behavior.format.field_0;
            puVar1 = (undefined8 *)(this->metaclass).reference.oop.field_0.uintValue;
            if (puVar1 != &NilObject) {
              *(anon_union_8_4_0eb573b0_for_Oop_0 *)(puVar1 + 4) =
                   (metaSuper->super_ClassDescription).super_Behavior.fixedVariableCount.field_0;
              if (superClass != (Class *)&NilObject) {
                return this;
              }
              puVar1 = (undefined8 *)(this->metaclass).reference.oop.field_0.uintValue;
              if (puVar1 != &NilObject) {
                puVar1[3] = 3;
                puVar1 = (undefined8 *)(this->metaclass).reference.oop.field_0.uintValue;
                if (puVar1 != &NilObject) {
                  puVar1[4] = 0x1f;
                  return this;
                }
              }
            }
          }
        }
        __function = 
        "T *Lodtalk::Ref<Lodtalk::Metaclass>::operator->() const [T = Lodtalk::Metaclass]";
        goto LAB_001335e4;
      }
    }
  }
  __function = "T *Lodtalk::Ref<Lodtalk::Class>::operator->() const [T = Lodtalk::Class]";
LAB_001335e4:
  __assert_fail("!isNil()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/include/Lodtalk/ObjectModel.hpp"
                ,0x3bf,__function);
}

Assistant:

ClassBuilder &ClassBuilder::setSuperclass(Class *superClass, Metaclass *metaSuper)
{
    // Copy the format from the super class
    clazz->superclass = superClass;
    if(!isNil(superClass))
    {
        clazz->format = superClass->format;
        clazz->fixedVariableCount = superClass->fixedVariableCount;
    }
    else
    {
        clazz->format = Oop::encodeSmallInteger(OF_EMPTY);
        clazz->fixedVariableCount = Oop::encodeSmallInteger(0);
    }

    // Set the meta class super class.
    metaclass->superclass = metaSuper;

    // Set the meta class format and fixed size
    metaclass->format = metaSuper->format;
    metaclass->fixedVariableCount = metaSuper->fixedVariableCount;
    if(isNil(superClass))
    {
        metaclass->format = Oop::encodeSmallInteger(OF_FIXED_SIZE);
        metaclass->fixedVariableCount = Oop::encodeSmallInteger(Class::ClassVariableCount);
    }

    return *this;
}